

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_unary_func_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,char *op,
          BaseType input_type,BaseType expected_result_type)

{
  bool forwarding;
  SPIRType *pSVar1;
  SPIRType *pSVar2;
  undefined4 in_register_0000008c;
  char (*ts_3) [2];
  char *op_local;
  string local_1e0;
  string expr;
  string cast_op;
  SPIRType expected_type;
  
  ts_3 = (char (*) [2])CONCAT44(in_register_0000008c,input_type);
  op_local = op;
  pSVar1 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  pSVar2 = Compiler::expression_type(&this->super_Compiler,op0);
  SPIRType::SPIRType(&expected_type,pSVar1);
  expected_type.width = pSVar2->width;
  expected_type.super_IVariant._12_4_ = input_type;
  if (*(BaseType *)&(pSVar2->super_IVariant).field_0xc == input_type) {
    to_unpacked_expression_abi_cxx11_(&cast_op,this,op0,true);
  }
  else {
    bitcast_glsl_abi_cxx11_(&cast_op,this,&expected_type,op0);
  }
  expr._M_dataplus._M_p = (pointer)&expr.field_2;
  expr._M_string_length = 0;
  expr.field_2._M_local_buf[0] = '\0';
  if (*(BaseType *)&(pSVar1->super_IVariant).field_0xc == expected_result_type) {
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_1e0,(spirv_cross *)&op_local,(char **)0x31efa1,(char (*) [2])&cast_op,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30ae46,ts_3);
    ::std::__cxx11::string::append((string *)&expr);
    ::std::__cxx11::string::~string((string *)&local_1e0);
  }
  else {
    expected_type.super_IVariant._12_4_ = expected_result_type;
    expected_type.width = pSVar1->width;
    (*(this->super_Compiler)._vptr_Compiler[0x34])(&local_1e0,this,pSVar1);
    ::std::__cxx11::string::operator=((string *)&expr,(string *)&local_1e0);
    ::std::__cxx11::string::~string((string *)&local_1e0);
    ::std::__cxx11::string::push_back((char)&expr);
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_1e0,(spirv_cross *)&op_local,(char **)0x31efa1,(char (*) [2])&cast_op,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30ae46,ts_3);
    ::std::__cxx11::string::append((string *)&expr);
    ::std::__cxx11::string::~string((string *)&local_1e0);
    ::std::__cxx11::string::push_back((char)&expr);
  }
  forwarding = should_forward(this,op0);
  emit_op(this,result_type,result_id,&expr,forwarding,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  ::std::__cxx11::string::~string((string *)&expr);
  ::std::__cxx11::string::~string((string *)&cast_op);
  SPIRType::~SPIRType(&expected_type);
  return;
}

Assistant:

void CompilerGLSL::emit_unary_func_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, const char *op,
                                           SPIRType::BaseType input_type, SPIRType::BaseType expected_result_type)
{
	auto &out_type = get<SPIRType>(result_type);
	auto &expr_type = expression_type(op0);
	auto expected_type = out_type;

	// Bit-widths might be different in unary cases because we use it for SConvert/UConvert and friends.
	expected_type.basetype = input_type;
	expected_type.width = expr_type.width;
	string cast_op = expr_type.basetype != input_type ? bitcast_glsl(expected_type, op0) : to_unpacked_expression(op0);

	string expr;
	if (out_type.basetype != expected_result_type)
	{
		expected_type.basetype = expected_result_type;
		expected_type.width = out_type.width;
		expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op, ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op, ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0));
	inherit_expression_dependencies(result_id, op0);
}